

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_psbt.cpp
# Opt level: O3

void __thiscall Psbt_UsecaseMultisig_Test::TestBody(Psbt_UsecaseMultisig_Test *this)

{
  AssertHelperData *pAVar1;
  bool bVar2;
  char cVar3;
  _func_int **__dest;
  pointer puVar4;
  void *pvVar5;
  undefined1 extraout_DL;
  long lVar6;
  ulong uVar7;
  _func_int *message;
  char *pcVar8;
  void **expected_predicate_value;
  size_t sVar9;
  initializer_list<cfd::core::Pubkey> __l;
  initializer_list<cfd::core::Pubkey> __l_00;
  initializer_list<cfd::core::KeyData> __l_01;
  initializer_list<cfd::core::ByteData> __l_02;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_1;
  ByteData256 sighash;
  AssertionResult gtest_ar_4;
  SigHashType sighash_type;
  ByteData sig1;
  Psbt psbt2;
  string path1;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> wsh_script;
  ByteData sig2;
  AssertionResult gtest_ar_10;
  Psbt psbt;
  HDWallet wallet2;
  HDWallet wallet1;
  string in_path;
  Psbt psbt1;
  Amount amount;
  Script multisig;
  TxIn txin;
  Transaction utxo_tx;
  Script out_multisig;
  Address addr;
  KeyData key_in2;
  KeyData key_in1;
  KeyData key2;
  KeyData key1;
  undefined1 local_df8 [16];
  undefined1 local_de8 [40];
  undefined1 local_dc0 [16];
  undefined1 local_db0 [8];
  undefined1 local_da8 [32];
  undefined8 uStack_d88;
  pointer local_d80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d60;
  Script local_d40;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_d00;
  ByteData256 local_ce8;
  undefined1 local_cc8 [24];
  Script local_cb0;
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  local_c78 [48];
  undefined1 *local_c48 [2];
  undefined1 local_c38 [16];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> local_c28;
  void *local_c10;
  undefined1 local_c08;
  undefined7 uStack_c07;
  internal local_bf8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_bf0;
  Psbt local_be8;
  void *local_b68 [3];
  void *local_b50 [3];
  undefined1 *local_b38 [2];
  undefined1 local_b28 [16];
  void *local_b18;
  void *local_b00;
  SigHashType local_ae4 [12];
  undefined1 local_ad8 [80];
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  local_a88 [256];
  KeyData local_988;
  Amount local_838 [16];
  undefined1 local_828 [56];
  AbstractTxIn local_7f0;
  Transaction local_760 [64];
  Script local_720;
  vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> local_6e8;
  Pubkey local_6c8;
  void *local_6a0;
  void *local_688;
  code *local_670 [15];
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_5f8;
  Script local_5e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5a0;
  KeyData local_570;
  KeyData local_420;
  KeyData local_2d0;
  KeyData local_180;
  
  cfd::Psbt::Psbt(&local_be8);
  cfd::core::ByteData::ByteData((ByteData *)local_ad8,(string *)&g_psbt_seed1_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_b50,(ByteData *)local_ad8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_ad8._0_8_);
  }
  cfd::core::ByteData::ByteData((ByteData *)local_ad8,(string *)&g_psbt_seed2_abi_cxx11_);
  cfd::core::HDWallet::HDWallet((HDWallet *)local_b68,(ByteData *)local_ad8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_ad8._0_8_);
  }
  local_c48[0] = local_c38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_c48,"44h/0h/0h/0/12","");
  cfd::core::HDWallet::GeneratePubkeyData((NetType)&local_180,(string *)local_b50);
  cfd::core::HDWallet::GeneratePubkeyData((NetType)&local_2d0,(string *)local_b68);
  cfd::core::KeyData::GetPubkey();
  cfd::core::KeyData::GetPubkey();
  __l._M_len = 2;
  __l._M_array = (iterator)local_ad8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            (&local_6e8,__l,(allocator_type *)&local_420);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)&local_720,(vector *)0x2,SUB81(&local_6e8,0));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector(&local_6e8);
  lVar6 = 0x18;
  do {
    if (*(void **)(local_ad8 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_ad8 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cfd::core::Address::Address((Address *)&local_6e8,kTestnet,kVersion0,&local_720);
  local_b38[0] = local_b28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b38,"44h/0h/0h/0/11","");
  cfd::core::HDWallet::GeneratePrivkeyData((NetType)&local_420,(string *)local_b50);
  cfd::core::HDWallet::GeneratePrivkeyData((NetType)&local_570,(string *)local_b68);
  cfd::core::KeyData::GetPubkey();
  cfd::core::KeyData::GetPubkey();
  __l_00._M_len = 2;
  __l_00._M_array = (iterator)local_ad8;
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_828 + 0x38),
             __l_00,(allocator_type *)local_cc8);
  cfd::core::ScriptUtil::CreateMultisigRedeemScript
            ((uint)local_828,(vector *)0x2,(bool)((char)local_828 + '8'));
  std::vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>::~vector
            ((vector<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_> *)(local_828 + 0x38));
  lVar6 = 0x18;
  do {
    if (*(void **)(local_ad8 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_ad8 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)(local_828 + 0x38),
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"multisig.GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_ad8._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_ad8 + 0x10))
  {
    operator_delete((void *)local_ad8._0_8_);
  }
  if ((char)local_7f0._vptr_AbstractTxIn == '\0') {
    testing::Message::Message((Message *)local_ad8);
    if (local_7f0.txid_._vptr_Txid == (_func_int **)0x0) {
      message = (_func_int *)0x293b13;
    }
    else {
      message = *local_7f0.txid_._vptr_Txid;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x455,(char *)message);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_7f0.txid_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
       );
  cfd::core::Transaction::Transaction(local_760,(string *)&g_psbt_utxo_sh_wsh_multi_abi_cxx11_);
  pAVar1 = (AssertHelperData *)(local_cc8 + 0x10);
  local_cc8._0_8_ = pAVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_cc8,"544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69",
             "");
  cfd::core::Txid::Txid((Txid *)local_ad8,(string *)local_cc8);
  cfd::core::TxIn::TxIn((TxIn *)(local_828 + 0x38),(Txid *)local_ad8,0,0xffffffff);
  local_ad8._0_8_ = &PTR__Txid_002dbe60;
  if ((pointer)local_ad8._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_ad8._8_8_);
  }
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Psbt::AddTxIn((TxIn *)&local_be8);
  cfd::core::Transaction::GetTxOut((uint)local_cc8);
  cfd::core::KeyData::KeyData((KeyData *)local_ad8);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)&local_be8,(TxOutReference *)0x0,(Script *)local_cc8,(KeyData *)local_828);
  cfd::core::KeyData::~KeyData((KeyData *)local_ad8);
  local_cc8._0_8_ = &PTR__AbstractTxOutReference_002dc150;
  cfd::core::Script::~Script(&local_cb0);
  cfd::core::SigHashType::SigHashType((SigHashType *)local_ad8);
  cfd::core::Psbt::SetTxInSighashType((uint)&local_be8,(SigHashType *)0x0);
  cfd::core::Psbt::GetTxInRedeemScriptDirect((uint)local_ad8,SUB81(&local_be8,0),false);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_dc0,
             "\"522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae\""
             ,"psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str()",
             "522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae"
             ,(char *)local_cc8._0_8_);
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_ad8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_ad8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x45f,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetTxInRedeemScriptDirect((uint)local_ad8,SUB81(&local_be8,0),false);
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_dc0,
             "\"00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9\"",
             "psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str()",
             "00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
             (char *)local_cc8._0_8_);
  if ((AssertHelperData *)local_cc8._0_8_ != pAVar1) {
    operator_delete((void *)local_cc8._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_ad8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_ad8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_cc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x461,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_cc8,(Message *)local_ad8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_cc8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_ad8._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_ad8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Amount::Amount(local_838,0x1dcd4b10);
  cfd::core::Address::GetLockingScript();
  cfd::core::Psbt::AddTxOut((Script *)&local_be8,(Amount *)local_ad8);
  cfd::core::Script::~Script((Script *)local_ad8);
  cfd::core::KeyData::KeyData((KeyData *)local_ad8,&local_180);
  cfd::core::KeyData::KeyData(&local_988,&local_2d0);
  __l_01._M_len = 2;
  __l_01._M_array = (iterator)local_ad8;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cc8,__l_01,
             (allocator_type *)local_dc0);
  cfd::core::Psbt::SetTxOutData((uint)&local_be8,(Script *)0x0,(vector *)&local_720);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)local_cc8);
  lVar6 = 0x150;
  do {
    cfd::core::KeyData::~KeyData((KeyData *)(local_ad8 + lVar6));
    lVar6 = lVar6 + -0x150;
  } while (lVar6 != -0x150);
  cfd::Psbt::Psbt((Psbt *)local_ad8);
  cfd::core::Psbt::AddTxIn((TxIn *)local_ad8);
  cfd::core::Transaction::GetTxOut((uint)local_cc8);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)local_ad8,(TxOutReference *)0x0,(Script *)local_cc8,(KeyData *)local_828);
  local_cc8._0_8_ = &PTR__AbstractTxOutReference_002dc150;
  cfd::core::Script::~Script(&local_cb0);
  cfd::Psbt::Psbt((Psbt *)local_cc8);
  cfd::core::Psbt::AddTxIn((TxIn *)local_cc8);
  cfd::core::Transaction::GetTxOut((uint)local_dc0);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)local_cc8,(TxOutReference *)0x0,(Script *)local_dc0,(KeyData *)local_828);
  local_dc0._0_8_ = &PTR__AbstractTxOutReference_002dc150;
  cfd::core::Script::~Script((Script *)local_da8);
  cfd::core::Psbt::Join(&local_be8.super_Psbt,SUB81(local_ad8,0));
  cfd::core::Psbt::Join(&local_be8.super_Psbt,SUB81(local_cc8,0));
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_dc0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((void *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_dc0);
    if ((AssertHelperData *)local_df8._8_8_ == (AssertHelperData *)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)(Type *)local_df8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x485,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d40,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d40,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA="
             ,(char *)local_dc0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((char)local_d40._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_dc0);
    if (local_d40.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_d40.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x486,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::Psbt::operator=((Psbt *)local_ad8,&local_be8);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Psbt::Sign((Privkey *)local_ad8,SUB81(local_dc0,0));
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::Psbt::operator=((Psbt *)local_cc8,&local_be8);
  cfd::core::Psbt::GetTxInSighashType((uint)&local_d00);
  cfd::core::Psbt::GetTxInUtxo((uint)local_dc0,SUB81(&local_be8,0),(bool *)0x0);
  cfd::core::Psbt::GetTransaction();
  cfd::core::Psbt::GetTxInRedeemScript((uint)local_df8,SUB81(&local_be8,0),(bool *)0x0);
  cfd::core::Script::GetData();
  cfd::core::SigHashType::SigHashType(local_ae4,(SigHashType *)&local_d00);
  local_c10 = (void *)cfd::core::AbstractTxOut::GetValue();
  expected_predicate_value = &local_c10;
  local_c08 = extraout_DL;
  cfd::core::Transaction::GetSignatureHash
            (&local_d60,&local_d40,0,&local_ce8,local_ae4,expected_predicate_value,0);
  if (local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_ce8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  cfd::core::Script::~Script((Script *)local_df8);
  cfd::core::KeyData::GetPrivkey();
  cfd::core::Privkey::CalculateEcSignature(&local_ce8,SUB81(local_df8,0));
  if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_df8._0_8_);
  }
  cfd::core::CryptoUtil::ConvertSignatureToDer((ByteData *)local_df8,(SigHashType *)&local_ce8);
  puVar4 = local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_df8._0_8_;
  local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_df8._8_8_;
  local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_de8._0_8_;
  local_df8._0_8_ = (AssertHelperData *)0x0;
  local_df8._8_8_ = (pointer)0x0;
  local_de8._0_8_ = (pointer)0x0;
  if (puVar4 != (pointer)0x0) {
    operator_delete(puVar4);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      operator_delete((void *)local_df8._0_8_);
    }
  }
  cfd::core::Psbt::SetTxInSignature((uint)local_cc8,(KeyData *)0x0,(ByteData *)&local_570);
  if ((AssertHelperData *)
      local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
    operator_delete(local_ce8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
      (void *)0x0) {
    operator_delete((void *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                     local_d60._M_dataplus._M_p._0_4_));
  }
  cfd::core::Transaction::~Transaction((Transaction *)&local_d40);
  local_dc0._0_8_ = cfd::AddressFactory::GetAddress;
  cfd::core::Script::~Script((Script *)local_da8);
  cfd::core::Psbt::Combine(&local_be8.super_Psbt);
  cfd::core::Psbt::Combine(&local_be8.super_Psbt);
  cfd::core::Psbt::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000\""
             ,"psbt.GetData().GetHex().c_str()",
             "70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000"
             ,(char *)local_dc0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((void *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_dc0);
    if ((pointer)local_df8._8_8_ == (pointer)0x0) {
      puVar4 = "";
    }
    else {
      puVar4 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_df8._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4a8,(char *)puVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d40,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d40);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::GetBase64_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d40,
             "\"cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA\""
             ,"psbt.GetBase64().c_str()",
             "cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA"
             ,(char *)local_dc0._0_8_);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  if ((char)local_d40._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_dc0);
    if (local_d40.script_data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_d40.script_data_.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_df8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4a9,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::KeyData::GetPubkey();
  cfd::core::Psbt::GetTxInSignature((uint)&local_ce8,(Pubkey *)&local_be8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::core::KeyData::GetPubkey();
  cfd::core::Psbt::GetTxInSignature((uint)&local_c10,(Pubkey *)&local_be8);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete((void *)local_dc0._0_8_);
  }
  cfd::core::Psbt::GetTxInRedeemScript((uint)&local_d40,SUB81(&local_be8,0),(bool *)0x0);
  cVar3 = cfd::core::Psbt::IsFinalizedInput((uint)&local_be8);
  local_df8._0_8_ = CONCAT71(local_df8._1_7_,cVar3) ^ 1;
  local_df8._8_8_ = (pointer)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","true","false",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4b3,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d00);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cVar3 = cfd::core::Psbt::IsFinalized();
  local_df8._0_8_ = CONCAT71(local_df8._1_7_,cVar3) ^ 1;
  local_df8._8_8_ = (pointer)0x0;
  if (cVar3 != '\0') {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,(AssertionResult *)"psbt.IsFinalized()",
               "true","false",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4b4,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d00);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ByteData::ByteData((ByteData *)local_dc0);
  local_da8._0_8_ = (_func_int **)0x0;
  local_da8._8_8_ = (pointer)0x0;
  local_da8._16_8_ = (pointer)0x0;
  uVar7 = (long)local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (uVar7 == 0) {
    __dest = (_func_int **)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (_func_int **)operator_new(uVar7);
    sVar9 = (long)local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start;
  }
  local_da8._16_8_ = uVar7 + (long)__dest;
  local_da8._0_8_ = __dest;
  if (local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_da8._8_8_ = __dest;
    memmove(__dest,local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                   ._M_impl.super__Vector_impl_data._M_start,sVar9);
  }
  local_da8._8_8_ = (long)__dest + sVar9;
  pvVar5 = (void *)CONCAT71(uStack_c07,local_c08);
  local_da8._24_8_ = (pointer)0x0;
  uStack_d88._0_1_ =
       (vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)0x0;
  uStack_d88._1_7_ = 0;
  local_d80 = (pointer)0x0;
  uVar7 = (long)pvVar5 - (long)local_c10;
  if (uVar7 == 0) {
    puVar4 = (pointer)0x0;
    sVar9 = 0;
  }
  else {
    if ((long)uVar7 < 0) {
      std::__throw_bad_alloc();
    }
    puVar4 = (pointer)operator_new(uVar7);
    pvVar5 = (void *)CONCAT71(uStack_c07,local_c08);
    sVar9 = (long)pvVar5 - (long)local_c10;
  }
  local_d80 = puVar4 + uVar7;
  local_da8._24_8_ = puVar4;
  if (pvVar5 != local_c10) {
    uStack_d88 = puVar4;
    memmove(puVar4,local_c10,sVar9);
  }
  uStack_d88 = puVar4 + sVar9;
  cfd::core::Script::GetData();
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)local_dc0;
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_df8,__l_02,
             (allocator_type *)&local_d60);
  cfd::core::Psbt::SetTxInFinalScript((uint)&local_be8,(vector *)0x0);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_df8);
  lVar6 = 0x48;
  do {
    if (*(void **)(local_dc0 + lVar6) != (void *)0x0) {
      operator_delete(*(void **)(local_dc0 + lVar6));
    }
    lVar6 = lVar6 + -0x18;
  } while (lVar6 != -0x18);
  cVar3 = cfd::core::Psbt::IsFinalizedInput((uint)&local_be8);
  local_df8[0] = (internal)cVar3;
  local_df8._8_8_ = (pointer)0x0;
  if (cVar3 == '\0') {
    testing::Message::Message((Message *)&local_d60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)local_df8,
               (AssertionResult *)"psbt.IsFinalizedInput(0)","false","true",
               (char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4b8,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d00,(Message *)&local_d60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d00);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if (CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
          (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,
                                       local_d60._M_dataplus._M_p._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Psbt::ClearTxInSignData((uint)&local_be8);
  cfd::core::Psbt::GetTxInFinalScript((uint)&local_d00,SUB81(&local_be8,0));
  cfd::core::Psbt::GetTxInFinalScript((uint)&local_c28,SUB81(&local_be8,0));
  local_d60._M_dataplus._M_p._0_4_ = 4;
  local_df8._0_8_ =
       ((long)local_d00.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_d00.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_dc0,"4","wit_script.size()",(int *)&local_d60,
             (unsigned_long *)local_df8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_df8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4bd,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)local_d00.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_d00.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x60) {
    cfd::core::Script::GetHex_abi_cxx11_();
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              ((internal *)&local_d60,"script.GetHex()","wit_script[3].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df8);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)local_de8) {
      operator_delete((void *)local_df8._0_8_);
    }
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if ((char)local_d60._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)local_dc0);
      if ((undefined8 *)local_d60._M_string_length == (undefined8 *)0x0) {
        pcVar8 = "";
      }
      else {
        pcVar8 = *(char **)local_d60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)local_df8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x4bf,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)local_df8,(Message *)local_dc0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_df8);
      if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_dc0._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(_func_int **)local_dc0._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_d60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  local_d60._M_dataplus._M_p._0_4_ = 1;
  local_df8._0_8_ =
       ((long)local_c28.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_c28.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  testing::internal::CmpHelperEQ<int,unsigned_long>
            ((internal *)local_dc0,"1","wsh_script.size()",(int *)&local_d60,
             (unsigned_long *)local_df8);
  if ((internal)local_dc0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_df8);
    if ((pointer)local_dc0._8_8_ == (pointer)0x0) {
      pcVar8 = "";
    }
    else {
      pcVar8 = *(char **)local_dc0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4c1,pcVar8);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_dc0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  if ((long)local_c28.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_finish -
      (long)local_c28.super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
            _M_impl.super__Vector_impl_data._M_start == 0x18) {
    cfd::core::ScriptUtil::CreateP2wshLockingScript((Script *)local_dc0);
    cfd::core::Script::GetData();
    cfd::core::ByteData::Serialize();
    cfd::core::ByteData::GetHex_abi_cxx11_();
    cfd::core::ByteData::GetHex_abi_cxx11_();
    testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
              (local_bf8,"exp_script.GetData().Serialize().GetHex()","wsh_script[0].GetHex()",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_df8,
               &local_d60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_) !=
        &local_d60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_d60._M_dataplus._M_p._4_4_,local_d60._M_dataplus._M_p._0_4_));
    }
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)local_de8) {
      operator_delete((void *)local_df8._0_8_);
    }
    if (local_b00 != (void *)0x0) {
      operator_delete(local_b00);
    }
    if (local_b18 != (void *)0x0) {
      operator_delete(local_b18);
    }
    if (local_bf8[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_df8);
      if (local_bf0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
         ) {
        pcVar8 = "";
      }
      else {
        pcVar8 = ((local_bf0.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_d60,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
                 ,0x4c4,pcVar8);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
      if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
          (**(code **)(*(long *)local_df8._0_8_ + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_bf0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    cfd::core::Script::~Script((Script *)local_dc0);
  }
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_c28);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector(&local_d00);
  cfd::core::Script::~Script(&local_d40);
  if (local_c10 != (void *)0x0) {
    operator_delete(local_c10);
  }
  if ((AssertHelperData *)
      local_ce8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (AssertHelperData *)0x0) {
    operator_delete(local_ce8.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_d40._vptr_Script._0_1_ = cfd::core::Psbt::IsFinalized();
  local_d40.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  if ((char)local_d40._vptr_Script == '\0') {
    testing::Message::Message((Message *)local_df8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_dc0,(internal *)&local_d40,(AssertionResult *)"psbt.IsFinalized()",
               "false","true",(char *)expected_predicate_value);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4cc,(char *)local_dc0._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)local_df8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_dc0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_db0) {
      operator_delete((void *)local_dc0._0_8_);
    }
    if ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((AssertHelperData *)local_df8._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_df8._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_d40.script_data_,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::Psbt::ExtractTransaction();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_df8,
             "\"02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000\""
             ,"tx.GetHex().c_str()",
             "02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000"
             ,(char *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script));
  if ((pointer *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) !=
      (pointer *)
      ((long)&local_d40.script_data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data + 8U)) {
    operator_delete((undefined1 *)
                    CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script));
  }
  if (local_df8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_d40);
    if ((pointer)local_df8._8_8_ == (pointer)0x0) {
      puVar4 = "";
    }
    else {
      puVar4 = (((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_df8._8_8_)->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_d60,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_psbt.cpp"
               ,0x4ce,(char *)puVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_d60,(Message *)&local_d40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_d60);
    if (CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) != (long *)0x0
         )) {
        (**(code **)(*(long *)CONCAT71(local_d40._vptr_Script._1_7_,(char)local_d40._vptr_Script) +
                    8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_df8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::Transaction::~Transaction((Transaction *)local_dc0);
  local_cc8._0_8_ = &PTR__Psbt_002e01a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(local_c78);
  cfd::core::Psbt::~Psbt((Psbt *)local_cc8);
  local_ad8._0_8_ = &PTR__Psbt_002e01a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree(local_a88);
  cfd::core::Psbt::~Psbt((Psbt *)local_ad8);
  cfd::core::AbstractTxIn::~AbstractTxIn((AbstractTxIn *)(local_828 + 0x38));
  cfd::core::Transaction::~Transaction(local_760);
  cfd::core::Script::~Script((Script *)local_828);
  cfd::core::KeyData::~KeyData(&local_570);
  cfd::core::KeyData::~KeyData(&local_420);
  if (local_b38[0] != local_b28) {
    operator_delete(local_b38[0]);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_5a0);
  cfd::core::Script::~Script(&local_5e0);
  local_670[0] = cfd::core::Psbt::CheckTxInIndex;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_5f8);
  cfd::core::TapBranch::~TapBranch((TapBranch *)local_670);
  if (local_688 != (void *)0x0) {
    operator_delete(local_688);
  }
  if (local_6a0 != (void *)0x0) {
    operator_delete(local_6a0);
  }
  if (local_6c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(local_6c8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
  }
  if (local_6e8.super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != &local_6c8) {
    operator_delete(local_6e8.
                    super__Vector_base<cfd::core::Pubkey,_std::allocator<cfd::core::Pubkey>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  cfd::core::Script::~Script(&local_720);
  cfd::core::KeyData::~KeyData(&local_2d0);
  cfd::core::KeyData::~KeyData(&local_180);
  if (local_c48[0] != local_c38) {
    operator_delete(local_c48[0]);
  }
  if (local_b68[0] != (void *)0x0) {
    operator_delete(local_b68[0]);
  }
  if (local_b50[0] != (void *)0x0) {
    operator_delete(local_b50[0]);
  }
  local_be8._0_8_ = &PTR__Psbt_002e01a0;
  std::
  _Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
  ::~_Rb_tree((_Rb_tree<cfd::core::OutPoint,_cfd::core::OutPoint,_std::_Identity<cfd::core::OutPoint>,_std::less<cfd::core::OutPoint>,_std::allocator<cfd::core::OutPoint>_>
               *)((long)&local_be8 + 0x50));
  cfd::core::Psbt::~Psbt(&local_be8.super_Psbt);
  return;
}

Assistant:

TEST(Psbt, UsecaseMultisig) {
  Psbt psbt;
  
  HDWallet wallet1 = HDWallet(ByteData(g_psbt_seed1));
  HDWallet wallet2 = HDWallet(ByteData(g_psbt_seed2));
  std::string path1 = "44h/0h/0h/0/12";
  auto key1 = wallet1.GeneratePubkeyData(NetType::kTestnet, path1);
  auto key2 = wallet2.GeneratePubkeyData(NetType::kTestnet, path1);
  auto out_multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key1.GetPubkey(), key2.GetPubkey()});
  auto addr = Address(NetType::kTestnet, WitnessVersion::kVersion0, out_multisig);

  std::string in_path = "44h/0h/0h/0/11";
  auto key_in1 = wallet1.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto key_in2 = wallet2.GeneratePrivkeyData(NetType::kTestnet, in_path);
  auto multisig = ScriptUtil::CreateMultisigRedeemScript(
    2, std::vector<Pubkey>{key_in1.GetPubkey(), key_in2.GetPubkey()});
  EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae", multisig.GetHex().c_str());

  Transaction utxo_tx(g_psbt_utxo_sh_wsh_multi);
  TxIn txin(Txid("544d545a1e53becbf9dd9b0e424e1189b8f6e46d6bc36b191816d341c2d32f69"), 0, 0xffffffff);

  try {
    psbt.AddTxIn(txin);
    psbt.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, KeyData());
    psbt.SetTxInSighashType(0, SigHashType());
    EXPECT_STREQ("522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae",
        psbt.GetTxInRedeemScriptDirect(0, true, true).GetHex().c_str());
    EXPECT_STREQ("00209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9",
        psbt.GetTxInRedeemScriptDirect(0, true, false).GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Amount amount(499993360);
  try {
    psbt.AddTxOut(addr.GetLockingScript(), amount);
    psbt.SetTxOutData(0, out_multisig, std::vector<KeyData>{key1, key2});
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt1;
  try {
    psbt1.AddTxIn(txin);
    psbt1.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in1);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  Psbt psbt2;
  try {
    psbt2.AddTxIn(txin);
    psbt2.SetTxInUtxo(0, utxo_tx.GetTxOut(0), multisig, key_in2);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Join(psbt1);
    psbt.Join(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f23175870103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHAQMEAQAAAAEEIgAgnE2ssl67itqLuxrduGnepNgXDMlR8dlpSyFU4VgydskBBUdSIQOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8yED9NRzYU6VSsT1UY5vfLMwe0+EdD4TftTuy19PtkPCO0dSriIGA6US9fWcDnkB/EeO1jU+73b0T5yywYW/vPfwubt2cWvzGCpwR2AsAACAAAAAgAAAAIAAAAAACwAAACIGA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHGJ1rbYYsAACAAAAAgAAAAIAAAAAACwAAAAABAUdSIQKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGeyECYix5dOwy3nWvo3M7CabDPQ3qUUsp+qzPsJkXdPRiIkJSriICAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCGJ1rbYYsAACAAAAAgAAAAIAAAAAADAAAACICApBtOZ9tu+zImNS43j9JdHTIakHyzzbXH5XlygawdIZ7GCpwR2AsAACAAAAAgAAAAIAAAAAADAAAAAA=", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt1 = psbt;
    psbt1.Sign(key_in1.GetPrivkey());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt2 = psbt;
    // psbt2.Sign(key_in2.GetPrivkey());
    // Same processing.
    auto sighash_type = psbt.GetTxInSighashType(0);
    auto utxo_txout = psbt.GetTxInUtxo(0);
    auto tx = psbt.GetTransaction();
    auto sighash = tx.GetSignatureHash(0, psbt.GetTxInRedeemScript(0).GetData(),
        sighash_type, utxo_txout.GetValue(), WitnessVersion::kVersion0);
    auto sig = key_in2.GetPrivkey().CalculateEcSignature(sighash);
    sig = CryptoUtil::ConvertSignatureToDer(sig, sighash_type);
    psbt2.SetTxInSignature(0, key_in2, sig);
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    psbt.Combine(psbt1);
    psbt.Combine(psbt2);
    EXPECT_STREQ("70736274ff01005e0200000001692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d540000000000ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc00000000000101200858cd1d0000000017a914945fb50391a70637c1ffc5ab7fb65308c2f2317587220203a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b8401220203f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4747304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc010103040100000001042200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9010547522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae220603a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf3182a7047602c0000800000008000000080000000000b000000220603f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b47189d6b6d862c0000800000008000000080000000000b00000000010147522102906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b2102622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f462224252ae220202622c7974ec32de75afa3733b09a6c33d0dea514b29faaccfb0991774f4622242189d6b6d862c0000800000008000000080000000000c000000220202906d399f6dbbecc898d4b8de3f497474c86a41f2cf36d71f95e5ca06b074867b182a7047602c0000800000008000000080000000000c00000000", psbt.GetData().GetHex().c_str());
    EXPECT_STREQ("cHNidP8BAF4CAAAAAWkv08JB0xYYGWvDa23k9riJEU5CDpvd+cu+Ux5aVE1UAAAAAAD/////ARBLzR0AAAAAIgAgPK0GGd5n5iR6dqECgTY1wFNFfGuk/eSsH/2BSNcOS8wAAAAAAAEBIAhYzR0AAAAAF6kUlF+1A5GnBjfB/8Wrf7ZTCMLyMXWHIgIDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/NHMEQCICBjWTfgUXDYPcMhOts6bq5mcTAI5KvDi0kSxWgN7E8MAiAzwIpxowdXsIRj1TDsBY7XQBlo+zC+9j1FSXIaDkhbhAEiAgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7R0cwRAIgXSdKeIfePvrehKSjScTDb1ibVWI7ECe32m2sicF4VjQCIGoDr+u7tgifHjf6yPmZpAFRYciSAUT9UxEtoFgEzUPMAQEDBAEAAAABBCIAIJxNrLJeu4rai7sa3bhp3qTYFwzJUfHZaUshVOFYMnbJAQVHUiEDpRL19ZwOeQH8R47WNT7vdvRPnLLBhb+89/C5u3Zxa/MhA/TUc2FOlUrE9VGOb3yzMHtPhHQ+E37U7stfT7ZDwjtHUq4iBgOlEvX1nA55AfxHjtY1Pu929E+cssGFv7z38Lm7dnFr8xgqcEdgLAAAgAAAAIAAAACAAAAAAAsAAAAiBgP01HNhTpVKxPVRjm98szB7T4R0PhN+1O7LX0+2Q8I7Rxida22GLAAAgAAAAIAAAACAAAAAAAsAAAAAAQFHUiECkG05n2277MiY1LjeP0l0dMhqQfLPNtcfleXKBrB0hnshAmIseXTsMt51r6NzOwmmwz0N6lFLKfqsz7CZF3T0YiJCUq4iAgJiLHl07DLeda+jczsJpsM9DepRSyn6rM+wmRd09GIiQhida22GLAAAgAAAAIAAAACAAAAAAAwAAAAiAgKQbTmfbbvsyJjUuN4/SXR0yGpB8s821x+V5coGsHSGexgqcEdgLAAAgAAAAIAAAACAAAAAAAwAAAAA", psbt.GetBase64().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    auto sig1 = psbt.GetTxInSignature(0, key_in1.GetPubkey());
    auto sig2 = psbt.GetTxInSignature(0, key_in2.GetPubkey());
    auto script = psbt.GetTxInRedeemScript(0);
    EXPECT_FALSE(psbt.IsFinalizedInput(0));
    EXPECT_FALSE(psbt.IsFinalized());
    psbt.SetTxInFinalScript(
        0, std::vector<ByteData>{ByteData(), sig1, sig2, script.GetData()});
    // psbt.Finalize();
    EXPECT_TRUE(psbt.IsFinalizedInput(0));
    psbt.ClearTxInSignData(0);

    auto wit_script = psbt.GetTxInFinalScript(0, true);
    auto wsh_script = psbt.GetTxInFinalScript(0, false);
    EXPECT_EQ(4, wit_script.size());
    if (4 == wit_script.size()) {
      EXPECT_EQ(script.GetHex(), wit_script[3].GetHex());
    }
    EXPECT_EQ(1, wsh_script.size());
    if (1 == wsh_script.size()) {
      auto exp_script = ScriptUtil::CreateP2wshLockingScript(script);
      EXPECT_EQ(exp_script.GetData().Serialize().GetHex(), wsh_script[0].GetHex());
    }
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }

  try {
    EXPECT_TRUE(psbt.IsFinalized());
    auto tx = psbt.ExtractTransaction();
    EXPECT_STREQ("02000000000101692fd3c241d31618196bc36b6de4f6b889114e420e9bddf9cbbe531e5a544d5400000000232200209c4dacb25ebb8ada8bbb1addb869dea4d8170cc951f1d9694b2154e1583276c9ffffffff01104bcd1d000000002200203cad0619de67e6247a76a102813635c053457c6ba4fde4ac1ffd8148d70e4bcc0400473044022020635937e05170d83dc3213adb3a6eae66713008e4abc38b4912c5680dec4f0c022033c08a71a30757b08463d530ec058ed7401968fb30bef63d4549721a0e485b840147304402205d274a7887de3efade84a4a349c4c36f589b55623b1027b7da6dac89c178563402206a03afebbbb6089f1e37fac8f999a4015161c8920144fd53112da05804cd43cc0147522103a512f5f59c0e7901fc478ed6353eef76f44f9cb2c185bfbcf7f0b9bb76716bf32103f4d473614e954ac4f5518e6f7cb3307b4f84743e137ed4eecb5f4fb643c23b4752ae00000000", tx.GetHex().c_str());
  } catch (const CfdException& except) {
    EXPECT_STREQ("", except.what());
    throw except;
  }
}